

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_get_tensor(ggml_context *ctx,char *name)

{
  void *pvVar1;
  ggml_object *pgVar2;
  size_t sVar3;
  int iVar4;
  ggml_object **ppgVar5;
  
  pvVar1 = ctx->mem_buffer;
  ppgVar5 = &ctx->objects_begin;
  do {
    pgVar2 = *ppgVar5;
    if (pgVar2 == (ggml_object *)0x0) {
      return (ggml_tensor *)0x0;
    }
    if (pgVar2->type == GGML_OBJECT_TYPE_TENSOR) {
      sVar3 = pgVar2->offs;
      iVar4 = strcmp((char *)((long)pvVar1 + sVar3 + 0x100),name);
      if (iVar4 == 0) {
        return (ggml_tensor *)((long)pvVar1 + sVar3);
      }
    }
    ppgVar5 = &pgVar2->next;
  } while( true );
}

Assistant:

struct ggml_tensor * ggml_get_tensor(struct ggml_context * ctx, const char * name) {
    struct ggml_object * obj = ctx->objects_begin;

    char * const mem_buffer = ctx->mem_buffer;

    while (obj != NULL) {
        if (obj->type == GGML_OBJECT_TYPE_TENSOR) {
            struct ggml_tensor * cur = (struct ggml_tensor *)(mem_buffer + obj->offs);
            if (strcmp(cur->name, name) == 0) {
                return cur;
            }
        }

        obj = obj->next;
    }

    return NULL;
}